

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_object.cpp
# Opt level: O3

object_ptr mjs::new_boolean(object_ptr *prototype,bool val)

{
  gc_heap *num_bytes;
  undefined8 extraout_RDX;
  undefined7 in_register_00000031;
  gc_heap_ptr_untyped *this;
  object_ptr oVar1;
  gc_heap_ptr<mjs::boolean_object> o;
  undefined1 local_48 [32];
  
  this = (gc_heap_ptr_untyped *)CONCAT71(in_register_00000031,val);
  num_bytes = this->heap_;
  gc_heap_ptr_untyped::get(this);
  object::class_name((object *)(local_48 + 0x10));
  gc_heap::
  allocate_and_construct<mjs::boolean_object,mjs::string,mjs::gc_heap_ptr<mjs::object>const&,bool&>
            ((gc_heap *)local_48,(size_t)num_bytes,(string *)0x20,
             (gc_heap_ptr<mjs::object> *)(local_48 + 0x10),(bool *)this);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_48 + 0x10));
  (prototype->super_gc_heap_ptr_untyped).heap_ = (gc_heap *)local_48._0_8_;
  (prototype->super_gc_heap_ptr_untyped).pos_ = local_48._8_4_;
  if ((gc_heap *)local_48._0_8_ != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_48._0_8_,&prototype->super_gc_heap_ptr_untyped);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_48);
  oVar1.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)prototype;
  return (object_ptr)oVar1.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr new_boolean(const object_ptr& prototype, bool val) {
    auto o = prototype.heap().make<boolean_object>(prototype->class_name(), prototype, val);
    return o;
}